

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_init_finish.c
# Opt level: O3

int this_section_dwarf_relevant(char *scn_name,int type,int *is_rela)

{
  int iVar1;
  
  iVar1 = _dwarf_startswith(scn_name,".zdebug_");
  if ((iVar1 == 0) && (iVar1 = _dwarf_startswith(scn_name,".debug_"), iVar1 == 0)) {
    iVar1 = _dwarf_ignorethissection(scn_name);
    if (iVar1 != 0) {
      return 0;
    }
    iVar1 = strcmp(scn_name,".eh_frame");
    if ((((iVar1 != 0) && (iVar1 = strcmp(scn_name,".gnu_debuglink"), iVar1 != 0)) &&
        (iVar1 = strcmp(scn_name,".note.gnu.build-id"), iVar1 != 0)) &&
       (iVar1 = strcmp(scn_name,".gdb_index"), iVar1 != 0)) {
      iVar1 = is_a_special_section_semi_dwarf(scn_name);
      if (iVar1 != 0) {
        return 1;
      }
      iVar1 = is_a_relx_section(scn_name,type,is_rela);
      return iVar1;
    }
  }
  return 1;
}

Assistant:

static int
this_section_dwarf_relevant(const char *scn_name,
    int type,
    int *is_rela)
{
    /* A small helper function for _dwarf_setup(). */
    if (_dwarf_startswith(scn_name, ".zdebug_") ||
        _dwarf_startswith(scn_name, ".debug_")) {
        /* standard debug */
        return TRUE;
    }
    if (_dwarf_ignorethissection(scn_name)) {
        return FALSE;
    }
    /* Now check if a special section could be
        in a section_group, but though seems unlikely. */
    if (!strcmp(scn_name, ".eh_frame")) {
        /*  This is not really a group related file, but
            it is harmless to consider it such. */
        return TRUE;
    }
    if (!strcmp(scn_name, ".gnu_debuglink")) {
        /*  This is not a group or DWARF related file, but
            it is useful for split dwarf. */
        return TRUE;
    }
    if (!strcmp(scn_name, ".note.gnu.build-id")) {
        /*  This is not a group or DWARF related file, but
            it is useful for split dwarf. */
        return TRUE;
    }
    if (!strcmp(scn_name, ".gdb_index")) {
        return TRUE;
    }
    if (is_a_special_section_semi_dwarf(scn_name)) {
        return TRUE;
    }
    if (is_a_relx_section(scn_name,type,is_rela)) {
        return TRUE;
    }
    /*  All sorts of sections are of no interest: .text
        .rel. and many others. */
    return FALSE;
}